

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

bool Fossilize::json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               (VkPipelineShaderStageCreateInfo *pStages,uint32_t stageCount,
               MemoryPoolAllocator<rapidjson::CrtAllocator> *alloc,Value *out_value)

{
  uint uVar1;
  VkSpecializationMapEntry *pVVar2;
  bool bVar3;
  VkSpecializationInfo *pVVar4;
  DynamicStateInfo *pDVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  Data local_178;
  Data local_168;
  DynamicStateInfo *local_150;
  Value stage;
  Data local_128;
  Value map_entries;
  Value spec;
  GenericStringRef<char> local_c8;
  Value map_entry;
  StringRefType local_a0;
  StringRefType local_90;
  StringRefType local_80;
  StringRefType local_70;
  StringRefType local_60;
  string local_50;
  
  local_128.n.i64 = (Number)0x0;
  local_128.s.str = (Ch *)0x4000000000000;
  if (stageCount != 0) {
    uVar8 = 0;
    bVar9 = false;
    local_150 = (DynamicStateInfo *)alloc;
    do {
      stage.data_.n = (Number)0x0;
      stage.data_.s.str = (Ch *)0x3000000000000;
      local_178._4_1_ = '\0';
      local_178._5_1_ = '\0';
      local_178._6_1_ = '\0';
      local_178._7_1_ = '\0';
      local_178._0_4_ = pStages[uVar8].flags;
      local_168.s.str = (Ch *)0x4050000003da262;
      local_168.n = (Number)0x5;
      local_178.s.str = (Ch *)((ulong)(-1 < (int)pStages[uVar8].flags) << 0x35 | 0x1d6000000000000);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&stage,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                          *)&local_168.s,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_178.s,alloc);
      local_60.s = "name";
      local_60.length = 4;
      local_c8.s = pStages[uVar8].pName;
      local_c8.length = rapidjson::GenericStringRef<char>::NotNullStrLen(&local_c8,local_c8.s);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&stage,&local_60,&local_c8,
                  (MemoryPoolAllocator<rapidjson::CrtAllocator> *)local_150);
      uint64_string<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                ((Fossilize *)&local_168.s,(uint64_t)pStages[uVar8].module,
                 (MemoryPoolAllocator<rapidjson::CrtAllocator> *)local_150);
      alloc = (MemoryPoolAllocator<rapidjson::CrtAllocator> *)local_150;
      local_178.s.str = (Ch *)0x4050000003a526b;
      local_178.n = (Number)0x6;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&stage,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                          *)&local_178.s,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_168.s,(MemoryPoolAllocator<rapidjson::CrtAllocator> *)local_150);
      local_70.s = "stage";
      local_70.length = 5;
      pDVar5 = (DynamicStateInfo *)alloc;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<VkShaderStageFlagBits>(&stage,&local_70,pStages[uVar8].stage,alloc);
      if (pStages[uVar8].pSpecializationInfo != (VkSpecializationInfo *)0x0) {
        spec.data_.n = (Number)0x0;
        spec.data_.s.str = (Ch *)0x3000000000000;
        local_80.s = "dataSize";
        local_80.length = 8;
        pDVar5 = (DynamicStateInfo *)alloc;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<unsigned_long>
                  ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)&spec,&local_80,(pStages[uVar8].pSpecializationInfo)->dataSize,alloc);
        local_90.s = "data";
        local_90.length = 4;
        encode_base64_abi_cxx11_
                  (&local_50,(Fossilize *)(pStages[uVar8].pSpecializationInfo)->pData,
                   (void *)(pStages[uVar8].pSpecializationInfo)->dataSize,(size_t)pDVar5);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
        ::AddMember<std::__cxx11::string>
                  ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                    *)&spec,&local_90,&local_50,alloc);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        alloc = (MemoryPoolAllocator<rapidjson::CrtAllocator> *)local_150;
        map_entries.data_.n = (Number)0x0;
        map_entries.data_.s.str = (Ch *)0x4000000000000;
        pVVar4 = pStages[uVar8].pSpecializationInfo;
        if (pVVar4->mapEntryCount != 0) {
          lVar6 = 8;
          uVar7 = 0;
          do {
            pVVar2 = pVVar4->pMapEntries;
            map_entry.data_.n = (Number)0x0;
            map_entry.data_.s.str = (Ch *)0x3000000000000;
            uVar1 = *(uint *)((long)pVVar2 + lVar6 + -4);
            local_178._4_1_ = '\0';
            local_178._5_1_ = '\0';
            local_178._6_1_ = '\0';
            local_178._7_1_ = '\0';
            local_178._0_4_ = uVar1;
            local_168.s.str = (Ch *)0x4050000003d4b5a;
            local_168.n = (Number)0x6;
            local_178.s.str = (Ch *)((ulong)(-1 < (int)uVar1) << 0x35 | 0x1d6000000000000);
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::AddMember(&map_entry,
                        (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                         *)&local_168.s,
                        (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                         *)&local_178.s,alloc);
            local_a0.s = "size";
            local_a0.length = 4;
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::AddMember<unsigned_long>
                      (&map_entry,&local_a0,*(unsigned_long *)((long)&pVVar2->constantID + lVar6),
                       alloc);
            uVar1 = *(uint *)((long)pVVar2 + lVar6 + -8);
            local_178._4_1_ = '\0';
            local_178._5_1_ = '\0';
            local_178._6_1_ = '\0';
            local_178._7_1_ = '\0';
            local_178._0_4_ = uVar1;
            local_168.s.str = (Ch *)0x4050000003a521a;
            local_168.n.i64 = (Number)0xa;
            local_178.s.str = (Ch *)((ulong)(-1 < (int)uVar1) << 0x35 | 0x1d6000000000000);
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::AddMember(&map_entry,
                        (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                         *)&local_168.s,
                        (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                         *)&local_178.s,alloc);
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::PushBack(&map_entries,&map_entry,alloc);
            uVar7 = uVar7 + 1;
            pVVar4 = pStages[uVar8].pSpecializationInfo;
            lVar6 = lVar6 + 0x10;
          } while (uVar7 < pVVar4->mapEntryCount);
        }
        local_178.s.str = (Ch *)0x4050000003a522e;
        local_178.n = (Number)0xa;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember(&spec,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                           *)&local_178.s,&map_entries,alloc);
        local_178.s.str = (Ch *)0x4050000003a5272;
        local_178.n.i64 = (Number)0x12;
        pDVar5 = (DynamicStateInfo *)alloc;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember(&stage,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                            *)&local_178.s,&spec,alloc);
      }
      bVar3 = pnext_chain_add_json_value<VkPipelineShaderStageCreateInfo,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                        (&stage,(VkPipelineShaderStageCreateInfo *)pStages[uVar8].pNext,alloc,pDVar5
                        );
      if (!bVar3) {
        return bVar9;
      }
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::PushBack((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)&local_128.s,&stage,alloc);
      uVar8 = uVar8 + 1;
      bVar9 = stageCount <= uVar8;
    } while (uVar8 != stageCount);
  }
  if (&local_128 != &out_value->data_) {
    (out_value->data_).n = local_128.n;
    (out_value->data_).s.str = local_128.s.str;
  }
  return true;
}

Assistant:

static bool json_value(const VkPipelineShaderStageCreateInfo *pStages, uint32_t stageCount,
                       Allocator &alloc, Value *out_value)
{
	Value stages(kArrayType);
	for (uint32_t i = 0; i < stageCount; i++)
	{
		auto &s = pStages[i];
		Value stage(kObjectType);
		stage.AddMember("flags", s.flags, alloc);
		stage.AddMember("name", StringRef(s.pName), alloc);
		stage.AddMember("module", uint64_string(api_object_cast<uint64_t>(s.module), alloc), alloc);
		stage.AddMember("stage", s.stage, alloc);
		if (s.pSpecializationInfo)
		{
			Value spec(kObjectType);
			spec.AddMember("dataSize", uint64_t(s.pSpecializationInfo->dataSize), alloc);
			spec.AddMember("data",
			               encode_base64(s.pSpecializationInfo->pData,
			                             s.pSpecializationInfo->dataSize), alloc);
			Value map_entries(kArrayType);
			for (uint32_t j = 0; j < s.pSpecializationInfo->mapEntryCount; j++)
			{
				auto &e = s.pSpecializationInfo->pMapEntries[j];
				Value map_entry(kObjectType);
				map_entry.AddMember("offset", e.offset, alloc);
				map_entry.AddMember("size", uint64_t(e.size), alloc);
				map_entry.AddMember("constantID", e.constantID, alloc);
				map_entries.PushBack(map_entry, alloc);
			}
			spec.AddMember("mapEntries", map_entries, alloc);
			stage.AddMember("specializationInfo", spec, alloc);
		}

		if (!pnext_chain_add_json_value(stage, s, alloc, nullptr))
			return false;
		stages.PushBack(stage, alloc);
	}

	*out_value = stages;
	return true;
}